

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::runTest
          (TransformFeedbackCase *this,DrawCall *first,DrawCall *end,deUint32 seed)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Precision PVar2;
  TextureFormat log;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  _Var3;
  code *pcVar4;
  RenderContext *pRVar5;
  char *pcVar6;
  pointer puVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  deUint32 dVar11;
  deUint32 dVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  DataType DVar16;
  undefined4 uVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ObjectTraits *traits;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  _Var19;
  Attribute *pAVar20;
  pointer puVar21;
  void *__s;
  undefined8 *puVar22;
  pointer ppAVar23;
  byte bVar24;
  uint uVar25;
  uint x;
  uint y;
  undefined8 uVar26;
  DrawCall *pDVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  pointer pAVar34;
  DrawCall *call;
  Attribute *pAVar35;
  pointer puVar36;
  int iVar37;
  int iVar38;
  pointer pOVar39;
  bool bVar40;
  bool bVar41;
  float fVar42;
  float fVar43;
  Random rnd;
  deUint32 available;
  vector<unsigned_char,_std::allocator<unsigned_char>_> inputData;
  Surface frameWithoutTf;
  Surface frameWithTf;
  deUint32 numPrimitives;
  Query primitiveQuery;
  uint local_314;
  int local_2f0;
  byte local_2ec;
  deRandom local_2b8;
  AttributeNameEquals local_2a8;
  Attribute *local_288;
  ulong local_280;
  pointer local_278;
  ulong local_270;
  int local_268;
  int local_264;
  long local_260;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_258;
  Surface local_240;
  Surface local_228;
  undefined7 *local_210;
  undefined8 local_208;
  undefined7 local_200;
  undefined4 uStack_1f9;
  undefined1 local_1f5;
  ObjectWrapper local_1f0;
  ulong local_1d8;
  ulong local_1d0;
  DrawCall *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  long lVar18;
  
  log = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar18 = CONCAT44(extraout_var,iVar9);
  deRandom_init(&local_2b8,seed);
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar9 = *(int *)CONCAT44(extraout_var_00,iVar9);
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar31 = 0x80;
  if (iVar9 < 0x80) {
    iVar31 = iVar9;
  }
  iVar10 = *(int *)(CONCAT44(extraout_var_01,iVar10) + 4);
  iVar37 = 0x80;
  if (iVar10 < 0x80) {
    iVar37 = iVar10;
  }
  dVar11 = deRandom_getUint32(&local_2b8);
  x = dVar11 % ((iVar9 - iVar31) + 1U);
  dVar11 = deRandom_getUint32(&local_2b8);
  y = dVar11 % ((iVar10 - iVar37) + 1U);
  tcu::Surface::Surface(&local_228,iVar31,iVar37);
  local_280 = CONCAT44(local_280._4_4_,iVar37);
  tcu::Surface::Surface(&local_240,iVar31,iVar37);
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_QUERY);
  glu::ObjectWrapper::ObjectWrapper(&local_1f0,(Functions *)CONCAT44(extraout_var_02,iVar9),traits);
  if (first == end) {
    local_2f0 = 0;
    local_314 = 0;
  }
  else {
    dVar11 = this->m_primitiveType;
    local_314 = 0;
    local_2f0 = 0;
    pDVar27 = first;
    do {
      iVar9 = pDVar27->numElements;
      dVar12 = 0;
      if (pDVar27->transformFeedbackEnabled == true) {
        dVar12 = getTransformFeedbackOutputCount(dVar11,iVar9);
      }
      local_2f0 = local_2f0 + dVar12;
      local_314 = local_314 + iVar9;
      pDVar27 = pDVar27 + 1;
    } while (pDVar27 != end);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_258,(long)(int)(this->m_inputStride * local_314),(allocator_type *)local_1b8);
  puVar7 = local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar9 = this->m_inputStride;
  _Var19._M_current =
       (this->m_attributes).
       super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var3._M_current =
       (this->m_attributes).
       super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  paVar1 = &local_2a8.name.field_2;
  local_2a8.name.field_2._M_allocated_capacity = 0x697469736f705f61;
  local_2a8.name.field_2._8_2_ = 0x6e6f;
  local_2a8.name._M_string_length = 10;
  local_2a8.name.field_2._M_local_buf[10] = '\0';
  local_2a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_1b8 = (undefined1  [8])local_1a8;
  std::__cxx11::string::_M_construct<char*>((string *)local_1b8,paVar1);
  _Var19 = std::
           find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                     (_Var19,_Var3,(AttributeNameEquals *)local_1b8);
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8,local_1a8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.name._M_dataplus._M_p,local_2a8.name.field_2._M_allocated_capacity + 1
                   );
  }
  uVar28 = (ulong)local_314;
  if (0 < (int)local_314) {
    iVar10 = 0;
    uVar29 = uVar28;
    do {
      iVar37 = (_Var19._M_current)->offset;
      fVar42 = deRandom_getFloat(&local_2b8);
      *(float *)(puVar7 + (long)iVar10 + (long)iVar37) = fVar42 * 2.4 + -1.2;
      fVar42 = deRandom_getFloat(&local_2b8);
      *(float *)(puVar7 + (long)iVar10 + (long)iVar37 + 4) = fVar42 * 2.4 + -1.2;
      fVar42 = deRandom_getFloat(&local_2b8);
      *(float *)(puVar7 + (long)iVar10 + (long)iVar37 + 8) = fVar42 * 2.4 + -1.2;
      fVar42 = deRandom_getFloat(&local_2b8);
      *(float *)(puVar7 + (long)iVar10 + (long)iVar37 + 0xc) = fVar42 * 1.9 + 0.1;
      iVar10 = iVar10 + iVar9;
      uVar29 = uVar29 - 1;
    } while (uVar29 != 0);
  }
  _Var19._M_current =
       (this->m_attributes).
       super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var3._M_current =
       (this->m_attributes).
       super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_200 = 0x746e696f705f61;
  uStack_1f9 = 0x657a6953;
  local_208 = 0xb;
  local_1f5 = 0;
  paVar1 = &local_2a8.name.field_2;
  local_2a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_210 = &local_200;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2a8,&local_200);
  _Var19 = std::
           find_if<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>,deqp::gles3::Functional::TransformFeedback::AttributeNameEquals>
                     (_Var19,_Var3,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.name._M_dataplus._M_p,local_2a8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,CONCAT17((undefined1)uStack_1f9,local_200) + 1);
  }
  pAVar20 = (this->m_attributes).
            super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((0 < (int)local_314) && (_Var19._M_current != pAVar20)) {
    iVar10 = 0;
    do {
      iVar37 = (_Var19._M_current)->offset;
      fVar42 = deRandom_getFloat(&local_2b8);
      *(float *)(puVar7 + (long)iVar10 + (long)iVar37) = fVar42 * 7.0 + 1.0;
      iVar10 = iVar10 + iVar9;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
    pAVar20 = (this->m_attributes).
              super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  pAVar35 = (this->m_attributes).
            super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar35 != pAVar20) {
    do {
      iVar10 = std::__cxx11::string::compare((char *)pAVar35);
      if ((iVar10 != 0) && (iVar10 = std::__cxx11::string::compare((char *)pAVar35), iVar10 != 0)) {
        DVar16 = (pAVar35->type).m_data.basic.type;
        PVar2 = (pAVar35->type).m_data.basic.precision;
        iVar10 = glu::getDataTypeScalarSize(DVar16);
        local_278 = (pointer)CONCAT44(local_278._4_4_,iVar10);
        if (0 < (int)local_314) {
          local_288 = (Attribute *)CONCAT44(local_288._4_4_,DVar16 - TYPE_INT);
          iVar10 = 0;
          uVar13 = 0;
          do {
            local_270 = CONCAT44(local_270._4_4_,iVar10);
            iVar37 = (int)local_278;
            if (0 < (int)local_278) {
              do {
                iVar14 = pAVar35->offset + iVar10;
                if (DVar16 - TYPE_FLOAT < 4) {
                  if (PVar2 == PRECISION_HIGHP) {
                    fVar42 = deRandom_getFloat(&local_2b8);
                    fVar42 = fVar42 * 200000.0 + -100000.0;
                  }
                  else if (PVar2 == PRECISION_MEDIUMP) {
                    fVar42 = deRandom_getFloat(&local_2b8);
                    fVar42 = fVar42 * 2000.0 + -1000.0;
                  }
                  else {
                    if (PVar2 != PRECISION_LOWP) goto LAB_0115ebf1;
                    dVar11 = deRandom_getUint32(&local_2b8);
                    fVar42 = (float)(dVar11 % 5) * 0.25 + 0.0;
                  }
                  *(float *)(puVar7 + iVar14) = fVar42;
                }
                else if ((uint)local_288 < 4) {
                  if (PVar2 == PRECISION_HIGHP) {
                    uVar15 = deRandom_getUint32(&local_2b8);
LAB_0115ebe8:
                    *(uint *)(puVar7 + iVar14) = uVar15;
                  }
                  else {
                    if (PVar2 == PRECISION_MEDIUMP) {
                      dVar11 = deRandom_getUint32(&local_2b8);
                      uVar15 = dVar11 & 0xffff;
                      uVar25 = (int)(short)dVar11 & 0xffff0000;
                    }
                    else {
                      if (PVar2 != PRECISION_LOWP) goto LAB_0115ebf1;
                      dVar11 = deRandom_getUint32(&local_2b8);
                      uVar15 = dVar11 & 0xff;
                      uVar25 = (int)(char)dVar11 & 0xffffff00;
                    }
                    *(uint *)(puVar7 + iVar14) = uVar25 | uVar15;
                  }
                }
                else if (DVar16 - TYPE_UINT < 4) {
                  if (PVar2 == PRECISION_HIGHP) {
                    uVar15 = deRandom_getUint32(&local_2b8);
                  }
                  else if (PVar2 == PRECISION_MEDIUMP) {
                    dVar11 = deRandom_getUint32(&local_2b8);
                    uVar15 = dVar11 & 0xffff;
                  }
                  else {
                    if (PVar2 != PRECISION_LOWP) goto LAB_0115ebf1;
                    dVar11 = deRandom_getUint32(&local_2b8);
                    uVar15 = dVar11 & 0xff;
                  }
                  goto LAB_0115ebe8;
                }
LAB_0115ebf1:
                iVar10 = iVar10 + 4;
                iVar37 = iVar37 + -1;
              } while (iVar37 != 0);
            }
            uVar13 = uVar13 + 1;
            iVar10 = (int)local_270 + iVar9;
          } while (uVar13 != local_314);
        }
      }
      pAVar35 = pAVar35 + 1;
    } while (pAVar35 !=
             (this->m_attributes).
             super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  (**(code **)(lVar18 + 0xd0))(0x8e22,(this->m_transformFeedback->super_ObjectWrapper).m_object);
  dVar11 = (**(code **)(lVar18 + 0x800))();
  glu::checkError(dVar11,"glBindTransformFeedback()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x449);
  puVar21 = (this->m_outputBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_outputBuffers).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar21) >> 2)) {
    uVar28 = 0;
    do {
      uVar13 = puVar21[uVar28];
      iVar9 = (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar28];
      (**(code **)(lVar18 + 0x40))(0x8c8e,uVar13);
      iVar10 = iVar9 * local_2f0;
      iVar9 = iVar9 * 2;
      (**(code **)(lVar18 + 0x150))(0x8c8e,(long)(iVar9 + iVar10),0,0x88e9);
      __s = (void *)(**(code **)(lVar18 + 0xd00))(0x8c8e,(long)iVar10,(long)iVar9,2);
      if (__s != (void *)0x0) {
        memset(__s,0xcd,(long)iVar9);
      }
      (**(code **)(lVar18 + 0x1670))(0x8c8e);
      dVar11 = (**(code **)(lVar18 + 0x800))();
      glu::checkError(dVar11,"guardband write",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                      ,0x324);
      (**(code **)(lVar18 + 0x48))(0x8c8e,uVar28 & 0xffffffff,uVar13);
      dVar11 = (**(code **)(lVar18 + 0x800))();
      glu::checkError(dVar11,"transform feedback buffer setup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                      ,0x45c);
      uVar28 = uVar28 + 1;
      puVar21 = (this->m_outputBuffers).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while ((long)uVar28 <
             (long)(int)((ulong)((long)(this->m_outputBuffers).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar21)
                        >> 2));
  }
  for (pAVar34 = (this->m_attributes).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pAVar34 !=
      (this->m_attributes).
      super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
      ._M_impl.super__Vector_impl_data._M_finish; pAVar34 = pAVar34 + 1) {
    iVar9 = (**(code **)(lVar18 + 0x780))
                      ((this->m_program->m_program).m_program,(pAVar34->name)._M_dataplus._M_p);
    DVar16 = glu::getDataTypeScalarType((pAVar34->type).m_data.basic.type);
    iVar10 = glu::getDataTypeScalarSize((pAVar34->type).m_data.basic.type);
    if (-1 < iVar9) {
      (**(code **)(lVar18 + 0x610))(iVar9);
      if (DVar16 == TYPE_UINT) {
        uVar26 = 0x1405;
      }
      else {
        if (DVar16 != TYPE_INT) {
          if (DVar16 == TYPE_FLOAT) {
            (**(code **)(lVar18 + 0x19f0))(iVar9,iVar10,0x1406,0);
          }
          goto LAB_0115ee55;
        }
        uVar26 = 0x1404;
      }
      (**(code **)(lVar18 + 0x1958))(iVar9,iVar10,uVar26,this->m_inputStride);
    }
LAB_0115ee55:
  }
  (**(code **)(lVar18 + 0x1a00))(x,y,iVar31,local_280 & 0xffffffff);
  (**(code **)(lVar18 + 0x1680))((this->m_program->m_program).m_program);
  pcVar4 = *(code **)(lVar18 + 0x15a8);
  uVar17 = (**(code **)(lVar18 + 0xb48))((this->m_program->m_program).m_program,"u_scale");
  local_1b8._0_4_ = 0x3c23d70a;
  local_1b8._4_4_ = 0x3c23d70a;
  pp_Stack_1b0 = (_func_int **)0x3c23d70a3c23d70a;
  (*pcVar4)(uVar17,1);
  pcVar4 = *(code **)(lVar18 + 0x15a8);
  uVar17 = (**(code **)(lVar18 + 0xb48))((this->m_program->m_program).m_program,"u_bias");
  local_1b8 = (undefined1  [8])&DAT_3f0000003f000000;
  pp_Stack_1b0 = (_func_int **)&DAT_3f0000003f000000;
  (*pcVar4)(uVar17,1);
  (**(code **)(lVar18 + 0x20))(0x8c88,local_1f0.m_object);
  dVar11 = (**(code **)(lVar18 + 0x800))();
  glu::checkError(dVar11,"glBeginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x47c);
  (**(code **)(lVar18 + 0x188))(0x4000);
  uVar17 = 0;
  if ((ulong)this->m_primitiveType < 7) {
    uVar17 = *(undefined4 *)(&DAT_01bf2da8 + (ulong)this->m_primitiveType * 4);
  }
  (**(code **)(lVar18 + 0x30))(uVar17);
  if (first != end) {
    iVar9 = 0;
    bVar24 = 1;
    pDVar27 = first;
    do {
      if (pDVar27->transformFeedbackEnabled != (bool)(bVar24 & 1)) {
        puVar22 = (undefined8 *)(lVar18 + 0xfe0);
        if (pDVar27->transformFeedbackEnabled != false) {
          puVar22 = (undefined8 *)(lVar18 + 0x1248);
        }
        (*(code *)*puVar22)();
        bVar24 = pDVar27->transformFeedbackEnabled;
      }
      (**(code **)(lVar18 + 0x538))(this->m_primitiveType,iVar9,pDVar27->numElements);
      iVar9 = iVar9 + pDVar27->numElements;
      pDVar27 = pDVar27 + 1;
    } while (pDVar27 != end);
    if ((bVar24 & 1) == 0) {
      (**(code **)(lVar18 + 0x1248))();
    }
  }
  (**(code **)(lVar18 + 0x638))();
  dVar11 = (**(code **)(lVar18 + 0x800))();
  glu::checkError(dVar11,"render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x49c);
  (**(code **)(lVar18 + 0x628))(0x8c88);
  dVar11 = (**(code **)(lVar18 + 0x800))();
  glu::checkError(dVar11,"glEndQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x4a0);
  local_2a8.name._M_dataplus._M_p = local_2a8.name._M_dataplus._M_p & 0xffffffff00000000;
  (**(code **)(lVar18 + 0xa20))(local_1f0.m_object,0x8867);
  dVar11 = (**(code **)(lVar18 + 0x800))();
  glu::checkError(dVar11,"glGetQueryObjectuiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x4a6);
  local_1b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1b0,
             "GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN status after submit: ",0x3e);
  pcVar6 = "mapped_ == GL_TRUE";
  if ((ChannelOrder)local_2a8.name._M_dataplus._M_p == R) {
    pcVar6 = "mapped_ == GL_FALSE";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1b0,pcVar6 + 0xb,
             (ulong)((ChannelOrder)local_2a8.name._M_dataplus._M_p == R) + 7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  puVar21 = (this->m_outputBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar36 = (this->m_outputBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)puVar36 - (long)puVar21) >> 2) < 1) {
    local_2ec = 1;
  }
  else {
    local_2ec = 1;
    uVar28 = 0;
    do {
      iVar9 = (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar28];
      (**(code **)(lVar18 + 0x40))(0x8c8e,puVar21[uVar28]);
      local_1d8 = (ulong)(uint)(iVar9 * local_2f0);
      local_1d0 = (ulong)(uint)(iVar9 * 2);
      local_260 = (**(code **)(lVar18 + 0xd00))(0x8c8e,0,(long)(iVar9 * 2 + iVar9 * local_2f0),1);
      dVar11 = (**(code **)(lVar18 + 0x800))();
      glu::checkError(dVar11,"mapping buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                      ,0x4b7);
      pOVar39 = (this->m_transformFeedbackOutputs).
                super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pOVar39 !=
          (this->m_transformFeedbackOutputs).
          super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          if (uVar28 == (uint)pOVar39->bufferNdx && first != end) {
            iVar10 = 0;
            iVar31 = 0;
            pDVar27 = first;
            do {
              bVar24 = pDVar27->transformFeedbackEnabled;
              iVar37 = pDVar27->numElements;
              if (((bool)bVar24 == true) &&
                 (ppAVar23 = (pOVar39->inputs).
                             super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                 0 < (int)((ulong)((long)(pOVar39->inputs).
                                         super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar23
                                  ) >> 3))) {
                dVar11 = this->m_primitiveType;
                iVar14 = this->m_inputStride;
                uVar13 = pOVar39->offset;
                local_1c0 = iVar10 * iVar9 + local_260;
                local_278 = local_258.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + iVar14 * iVar31;
                uVar29 = 0;
                local_268 = iVar31;
                local_264 = iVar10;
                local_1c8 = pDVar27;
                do {
                  local_270 = (ulong)uVar13;
                  pAVar20 = ppAVar23[uVar29];
                  DVar16 = (pAVar20->type).m_data.basic.type;
                  local_280 = uVar29;
                  uVar13 = glu::getDataTypeScalarSize(DVar16);
                  PVar2 = (pAVar20->type).m_data.basic.precision;
                  DVar16 = glu::getDataTypeScalarType(DVar16);
                  dVar12 = getTransformFeedbackOutputCount(dVar11,iVar37);
                  if (0 < (int)dVar12) {
                    iVar31 = 0;
                    uVar29 = 0;
                    do {
                      iVar38 = (int)uVar29;
                      iVar10 = iVar38;
                      switch(dVar11) {
                      case 0:
                      case 1:
                      case 4:
                        break;
                      case 2:
                        iVar10 = iVar38 - ((int)(((uint)(uVar29 >> 0x1f) & 1) + iVar38) >> 1);
                        if (iVar37 <= iVar10) {
                          iVar10 = 0;
                        }
                        break;
                      case 3:
                        iVar10 = iVar38 - ((int)(((uint)(uVar29 >> 0x1f) & 1) + iVar38) >> 1);
                        break;
                      case 5:
                        iVar33 = (int)((uVar29 & 0xffffffff) / 3);
                        uVar15 = iVar38 + iVar33 * -3;
                        iVar10 = (iVar33 - uVar15) + 1;
                        if (((uVar29 & 0xffffffff) / 3 & 1) == 0) {
                          iVar10 = iVar33 + uVar15;
                        }
                        if (1 < uVar15) {
                          iVar10 = iVar33 + uVar15;
                        }
                        break;
                      case 6:
                        iVar10 = iVar38 + (int)((uVar29 & 0xffffffff) / 3) * -3;
                        if (iVar10 == 0) goto LAB_0115f3a1;
                        iVar10 = (int)((uVar29 & 0xffffffff) / 3) + iVar10;
                        break;
                      default:
LAB_0115f3a1:
                        iVar10 = 0;
                      }
                      local_288 = pAVar20;
                      if (0 < (int)uVar13) {
                        uVar30 = 0;
                        do {
                          fVar42 = *(float *)(local_278 +
                                             uVar30 * 4 +
                                             (long)pAVar20->offset + (long)(iVar10 * iVar14));
                          fVar43 = *(float *)((long)iVar31 + (int)local_270 + local_1c0 + uVar30 * 4
                                             );
                          if (DVar16 == TYPE_FLOAT) {
                            if (PVar2 == PRECISION_LOWP) {
                              fVar42 = fVar42 - fVar43;
                              fVar43 = -fVar42;
                              if (-fVar42 <= fVar42) {
                                fVar43 = fVar42;
                              }
                              if (fVar43 < 0.1) goto LAB_0115f478;
                            }
                            else if (PVar2 == PRECISION_MEDIUMP) {
                              iVar32 = (int)fVar42 - (int)fVar43;
                              iVar33 = -iVar32;
                              if (0 < iVar32) {
                                iVar33 = iVar32;
                              }
                              if (iVar33 < 0x2002) goto LAB_0115f478;
                            }
                            else if (PVar2 == PRECISION_HIGHP) {
                              iVar32 = (int)fVar42 - (int)fVar43;
                              iVar33 = -iVar32;
                              if (0 < iVar32) {
                                iVar33 = iVar32;
                              }
                              if (iVar33 < 2) goto LAB_0115f478;
                            }
LAB_0115f533:
                            local_1b8 = (undefined1  [8])log;
                            std::__cxx11::ostringstream::ostringstream
                                      ((ostringstream *)&pp_Stack_1b0);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&pp_Stack_1b0,"Mismatch in ",0xc);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&pp_Stack_1b0,(pOVar39->name)._M_dataplus._M_p,
                                       (pOVar39->name)._M_string_length);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&pp_Stack_1b0," (",2);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&pp_Stack_1b0,(local_288->name)._M_dataplus._M_p,
                                       (local_288->name)._M_string_length);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&pp_Stack_1b0,"), output = ",0xc);
                            std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar38);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&pp_Stack_1b0,", input = ",10);
                            std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar10);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&pp_Stack_1b0,", component = ",0xe);
                            std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,(int)uVar30);
                            tcu::MessageBuilder::operator<<
                                      ((MessageBuilder *)local_1b8,
                                       (EndMessageToken *)&tcu::TestLog::EndMessage);
                            std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)&pp_Stack_1b0);
                            std::ios_base::~ios_base(local_140);
                            local_2ec = 0;
                            goto LAB_0115f645;
                          }
                          if (fVar42 != fVar43) goto LAB_0115f533;
LAB_0115f478:
                          uVar30 = uVar30 + 1;
                        } while (uVar13 != uVar30);
                      }
                      uVar29 = uVar29 + 1;
                      iVar31 = iVar31 + iVar9;
                    } while (uVar29 != dVar12);
                  }
                  uVar13 = (int)local_270 + uVar13 * 4;
                  uVar29 = local_280 + 1;
                  ppAVar23 = (pOVar39->inputs).
                             super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                } while ((long)uVar29 <
                         (long)(int)((ulong)((long)(pOVar39->inputs).
                                                                                                      
                                                  super__Vector_base<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::allocator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)ppAVar23) >> 3));
                iVar37 = local_1c8->numElements;
                bVar24 = local_1c8->transformFeedbackEnabled;
                pDVar27 = local_1c8;
                iVar31 = local_268;
                iVar10 = local_264;
              }
              dVar11 = 0;
              if ((bVar24 & 1) != 0) {
                dVar11 = getTransformFeedbackOutputCount(this->m_primitiveType,iVar37);
              }
              iVar31 = iVar31 + iVar37;
              iVar10 = iVar10 + dVar11;
              pDVar27 = pDVar27 + 1;
            } while (pDVar27 != end);
          }
LAB_0115f645:
          pOVar39 = pOVar39 + 1;
        } while (pOVar39 !=
                 (this->m_transformFeedbackOutputs).
                 super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (0 < (int)local_1d0) {
        if (*(char *)(local_260 + (int)local_1d8) == -0x33) {
          uVar29 = 1;
          do {
            uVar30 = uVar29;
            if ((local_1d0 & 0xffffffff) == uVar30) break;
            uVar29 = uVar30 + 1;
          } while (((char *)(local_260 + (int)local_1d8))[uVar30] == -0x33);
          if ((local_1d0 & 0xffffffff) <= uVar30) goto LAB_0115f708;
        }
        local_1b8 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1b0,"Error: Transform feedback buffer overrun detected",0x31
                  );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
        std::ios_base::~ios_base(local_140);
        local_2ec = 0;
      }
LAB_0115f708:
      (**(code **)(lVar18 + 0x1670))(0x8c8e);
      uVar28 = uVar28 + 1;
      puVar21 = (this->m_outputBuffers).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar36 = (this->m_outputBuffers).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while ((long)uVar28 < (long)(int)((ulong)((long)puVar36 - (long)puVar21) >> 2));
  }
  iVar9 = 0;
  if (first != end) {
    iVar9 = 0;
    pDVar27 = first;
    do {
      if (pDVar27->transformFeedbackEnabled != true) goto LAB_0115f7e6;
      if (6 < this->m_primitiveType) {
        iVar31 = 0;
        goto switchD_0115f795_caseD_0;
      }
      iVar31 = pDVar27->numElements;
      switch(this->m_primitiveType) {
      case 0:
        break;
      case 1:
        iVar31 = iVar31 / 2;
        break;
      case 2:
        if (iVar31 < 2) {
          iVar31 = 0;
        }
        break;
      case 3:
        iVar31 = iVar31 + -1;
        goto LAB_0115f7ca;
      case 4:
        iVar31 = iVar31 / 3;
        break;
      default:
        iVar31 = iVar31 + -2;
LAB_0115f7ca:
        if (iVar31 < 1) {
          iVar31 = 0;
        }
      }
switchD_0115f795_caseD_0:
      iVar9 = iVar9 + iVar31;
LAB_0115f7e6:
      pDVar27 = pDVar27 + 1;
    } while (pDVar27 != end);
  }
  local_2a8.name._M_dataplus._M_p = local_2a8.name._M_dataplus._M_p & 0xffffffff00000000;
  local_210 = (undefined7 *)((ulong)local_210 & 0xffffffff00000000);
  (**(code **)(lVar18 + 0xa20))(local_1f0.m_object,0x8867);
  (**(code **)(lVar18 + 0xa20))(local_1f0.m_object,0x8866,&local_210);
  dVar11 = (**(code **)(lVar18 + 0x800))();
  glu::checkError(dVar11,"glGetQueryObjectuiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x4e9);
  bVar40 = (ChannelOrder)local_2a8.name._M_dataplus._M_p != R;
  if (!bVar40 && puVar21 == puVar36) {
    local_1b8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1b0,
               "ERROR: GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN result not available after mapping buffers!"
               ,0x5b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
    std::ios_base::~ios_base(local_140);
  }
  local_1b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1b0,"GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN = ",0x2b);
  std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_1b0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  bVar41 = (int)local_210 == iVar9;
  if (!bVar41) {
    local_1b8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1b0,"ERROR: Expected ",0x10);
    std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0," primitives!",0xc);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
    std::ios_base::~ios_base(local_140);
  }
  (**(code **)(lVar18 + 0xd0))(0x8e22,0);
  if (0 < (int)((ulong)((long)(this->m_outputBuffers).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_outputBuffers).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    iVar9 = 0;
    do {
      (**(code **)(lVar18 + 0x40))(0x8c8e,0);
      (**(code **)(lVar18 + 0x48))(0x8c8e,iVar9,0);
      iVar9 = iVar9 + 1;
    } while (iVar9 < (int)((ulong)((long)(this->m_outputBuffers).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_outputBuffers).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2a8.name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_228.m_pixels.m_cap != (void *)0x0) {
    local_228.m_pixels.m_cap = (size_t)local_228.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_2a8,local_228.m_width,
             local_228.m_height,1,(void *)local_228.m_pixels.m_cap);
  glu::readPixels(pRVar5,x,y,(PixelBufferAccess *)local_1b8);
  (**(code **)(lVar18 + 0x188))(0x4000);
  if (first != end) {
    iVar9 = 0;
    do {
      (**(code **)(lVar18 + 0x538))(this->m_primitiveType,iVar9,first->numElements);
      iVar9 = iVar9 + first->numElements;
      first = first + 1;
    } while (first != end);
  }
  dVar11 = (**(code **)(lVar18 + 0x800))();
  glu::checkError(dVar11,"render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x511);
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2a8.name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_240.m_pixels.m_cap != (void *)0x0) {
    local_240.m_pixels.m_cap = (size_t)local_240.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_2a8,local_240.m_width,
             local_240.m_height,1,(void *)local_240.m_pixels.m_cap);
  glu::readPixels(pRVar5,x,y,(PixelBufferAccess *)local_1b8);
  local_1b8._0_4_ = 0x1010101;
  bVar8 = tcu::pixelThresholdCompare
                    ((TestLog *)log,"Result","Image comparison result",&local_240,&local_228,
                     (RGBA *)local_1b8,COMPARE_LOG_ON_ERROR);
  if (bVar8) {
    local_1b8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1b0,
               "Rendering result comparison between TF enabled and TF disabled passed.",0x46);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1b0,
               "ERROR: Rendering result comparison between TF enabled and TF disabled failed!",0x4d)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  if (local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_1f0);
  tcu::Surface::~Surface(&local_240);
  tcu::Surface::~Surface(&local_228);
  return (bool)(local_2ec & (bVar41 && (bVar40 || puVar21 != puVar36)) & bVar8);
}

Assistant:

bool TransformFeedbackCase::runTest (const DrawCall* first, const DrawCall* end, deUint32 seed)
{
	TestLog&				log				= m_testCtx.getLog();
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	de::Random				rnd				(seed);
	int						numInputs		= 0;		//!< Sum of element counts in calls.
	int						numOutputs		= 0;		//!< Sum of output counts for calls that have transform feedback enabled.
	int						width			= m_context.getRenderContext().getRenderTarget().getWidth();
	int						height			= m_context.getRenderContext().getRenderTarget().getHeight();
	int						viewportW		= de::min((int)VIEWPORT_WIDTH, width);
	int						viewportH		= de::min((int)VIEWPORT_HEIGHT, height);
	int						viewportX		= rnd.getInt(0, width-viewportW);
	int						viewportY		= rnd.getInt(0, height-viewportH);
	tcu::Surface			frameWithTf		(viewportW, viewportH);
	tcu::Surface			frameWithoutTf	(viewportW, viewportH);
	glu::Query				primitiveQuery	(m_context.getRenderContext());
	bool					outputsOk		= true;
	bool					imagesOk		= true;
	bool					queryOk			= true;

	// Compute totals.
	for (const DrawCall* call = first; call != end; call++)
	{
		numInputs	+= call->numElements;
		numOutputs	+= call->transformFeedbackEnabled ? getTransformFeedbackOutputCount(m_primitiveType, call->numElements) : 0;
	}

	// Input data.
	vector<deUint8> inputData(m_inputStride*numInputs);
	genInputData(m_attributes, numInputs, m_inputStride, &inputData[0], rnd);

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transformFeedback->get());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback()");

	// Allocate storage for transform feedback output buffers and bind to targets.
	for (int bufNdx = 0; bufNdx < (int)m_outputBuffers.size(); bufNdx++)
	{
		deUint32		buffer		= m_outputBuffers[bufNdx];
		int				stride		= m_bufferStrides[bufNdx];
		int				target		= bufNdx;
		int				size		= stride*numOutputs;
		int				guardSize	= stride*BUFFER_GUARD_MULTIPLIER;
		const deUint32	usage		= GL_DYNAMIC_READ;

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, size+guardSize, DE_NULL, usage);
		writeBufferGuard(gl, GL_TRANSFORM_FEEDBACK_BUFFER, size, guardSize);

		// \todo [2012-07-30 pyry] glBindBufferRange()?
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, target, buffer);

		GLU_EXPECT_NO_ERROR(gl.getError(), "transform feedback buffer setup");
	}

	// Setup attributes.
	for (vector<Attribute>::const_iterator attrib = m_attributes.begin(); attrib != m_attributes.end(); attrib++)
	{
		int				loc				= gl.getAttribLocation(m_program->getProgram(), attrib->name.c_str());
		glu::DataType	scalarType		= glu::getDataTypeScalarType(attrib->type.getBasicType());
		int				numComponents	= glu::getDataTypeScalarSize(attrib->type.getBasicType());
		const void*		ptr				= &inputData[0] + attrib->offset;

		if (loc >= 0)
		{
			gl.enableVertexAttribArray(loc);

			if (scalarType == glu::TYPE_FLOAT)		gl.vertexAttribPointer	(loc, numComponents, GL_FLOAT, GL_FALSE, m_inputStride, ptr);
			else if (scalarType == glu::TYPE_INT)	gl.vertexAttribIPointer	(loc, numComponents, GL_INT, m_inputStride, ptr);
			else if (scalarType == glu::TYPE_UINT)	gl.vertexAttribIPointer	(loc, numComponents, GL_UNSIGNED_INT, m_inputStride, ptr);
		}
	}

	// Setup viewport.
	gl.viewport(viewportX, viewportY, viewportW, viewportH);

	// Setup program.
	gl.useProgram(m_program->getProgram());

	gl.uniform4fv(gl.getUniformLocation(m_program->getProgram(), "u_scale"),	1, tcu::Vec4(0.01f).getPtr());
	gl.uniform4fv(gl.getUniformLocation(m_program->getProgram(), "u_bias"),		1, tcu::Vec4(0.5f).getPtr());

	// Enable query.
	gl.beginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, *primitiveQuery);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)");

	// Draw.
	{
		int		offset		= 0;
		bool	tfEnabled	= true;

		gl.clear(GL_COLOR_BUFFER_BIT);

		gl.beginTransformFeedback(getTransformFeedbackPrimitiveMode(m_primitiveType));

		for (const DrawCall* call = first; call != end; call++)
		{
			// Pause or resume transform feedback if necessary.
			if (call->transformFeedbackEnabled != tfEnabled)
			{
				if (call->transformFeedbackEnabled)
					gl.resumeTransformFeedback();
				else
					gl.pauseTransformFeedback();
				tfEnabled = call->transformFeedbackEnabled;
			}

			gl.drawArrays(m_primitiveType, offset, call->numElements);
			offset += call->numElements;
		}

		// Resume feedback before finishing it.
		if (!tfEnabled)
			gl.resumeTransformFeedback();

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "render");
	}

	gl.endQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)");

	// Check and log query status right after submit
	{
		deUint32 available = GL_FALSE;
		gl.getQueryObjectuiv(*primitiveQuery, GL_QUERY_RESULT_AVAILABLE, &available);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv()");

		log << TestLog::Message << "GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN status after submit: " << (available != GL_FALSE ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;
	}

	// Compare result buffers.
	for (int bufferNdx = 0; bufferNdx < (int)m_outputBuffers.size(); bufferNdx++)
	{
		deUint32		buffer		= m_outputBuffers[bufferNdx];
		int				stride		= m_bufferStrides[bufferNdx];
		int				size		= stride*numOutputs;
		int				guardSize	= stride*BUFFER_GUARD_MULTIPLIER;
		const void*		bufPtr		= DE_NULL;

		// Bind buffer for reading.
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		bufPtr = gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, size+guardSize, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "mapping buffer");

		// Verify all output variables that are written to this buffer.
		for (vector<Output>::const_iterator out = m_transformFeedbackOutputs.begin(); out != m_transformFeedbackOutputs.end(); out++)
		{
			if (out->bufferNdx != bufferNdx)
				continue;

			int inputOffset		= 0;
			int	outputOffset	= 0;

			// Process all draw calls and check ones with transform feedback enabled.
			for (const DrawCall* call = first; call != end; call++)
			{
				if (call->transformFeedbackEnabled)
				{
					const deUint8*	inputPtr	= &inputData[0] + inputOffset*m_inputStride;
					const deUint8*	outputPtr	= (const deUint8*)bufPtr + outputOffset*stride;

					if (!compareTransformFeedbackOutput(log, m_primitiveType, *out, call->numElements, inputPtr, m_inputStride, outputPtr, stride))
					{
						outputsOk = false;
						break;
					}
				}

				inputOffset		+= call->numElements;
				outputOffset	+= call->transformFeedbackEnabled ? getTransformFeedbackOutputCount(m_primitiveType, call->numElements) : 0;
			}
		}

		// Verify guardband.
		if (!verifyGuard((const deUint8*)bufPtr + size, guardSize))
		{
			log << TestLog::Message << "Error: Transform feedback buffer overrun detected" << TestLog::EndMessage;
			outputsOk = false;
		}

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	}

	// Check status after mapping buffers.
	{
		const bool	mustBeReady		= !m_outputBuffers.empty(); // Mapping buffer forces synchronization.
		const int	expectedCount	= computeTransformFeedbackPrimitiveCount(m_primitiveType, first, end);
		deUint32	available		= GL_FALSE;
		deUint32	numPrimitives	= 0;

		gl.getQueryObjectuiv(*primitiveQuery, GL_QUERY_RESULT_AVAILABLE, &available);
		gl.getQueryObjectuiv(*primitiveQuery, GL_QUERY_RESULT, &numPrimitives);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv()");

		if (!mustBeReady && available == GL_FALSE)
		{
			log << TestLog::Message << "ERROR: GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN result not available after mapping buffers!" << TestLog::EndMessage;
			queryOk = false;
		}

		log << TestLog::Message << "GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN = " << numPrimitives << TestLog::EndMessage;

		if ((int)numPrimitives != expectedCount)
		{
			log << TestLog::Message << "ERROR: Expected " << expectedCount << " primitives!" << TestLog::EndMessage;
			queryOk = false;
		}
	}

	// Clear transform feedback state.
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
	for (int bufNdx = 0; bufNdx < (int)m_outputBuffers.size(); bufNdx++)
	{
		gl.bindBuffer		(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
		gl.bindBufferBase	(GL_TRANSFORM_FEEDBACK_BUFFER, bufNdx, 0);
	}

	// Read back rendered image.
	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, frameWithTf.getAccess());

	// Render without transform feedback.
	{
		int offset = 0;

		gl.clear(GL_COLOR_BUFFER_BIT);

		for (const DrawCall* call = first; call != end; call++)
		{
			gl.drawArrays(m_primitiveType, offset, call->numElements);
			offset += call->numElements;
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "render");
		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, frameWithoutTf.getAccess());
	}

	// Compare images with and without transform feedback.
	imagesOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", frameWithoutTf, frameWithTf, tcu::RGBA(1, 1, 1, 1), tcu::COMPARE_LOG_ON_ERROR);

	if (imagesOk)
		m_testCtx.getLog() << TestLog::Message << "Rendering result comparison between TF enabled and TF disabled passed." << TestLog::EndMessage;
	else
		m_testCtx.getLog() << TestLog::Message << "ERROR: Rendering result comparison between TF enabled and TF disabled failed!" << TestLog::EndMessage;

	return outputsOk && imagesOk && queryOk;
}